

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

int __thiscall ncnn::Fold::forward(Fold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t *psVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Mat *pMVar10;
  float *pfVar11;
  int _w;
  int iVar12;
  int iVar13;
  void *__s;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  float *pfVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  int size;
  Option opt_b;
  Mat local_118;
  Mat *local_d0;
  Mat *local_c8;
  size_t local_c0;
  size_t local_b8;
  Option *local_b0;
  long local_a8;
  size_t local_a0;
  long local_98;
  void *local_90;
  ulong local_88;
  void *local_80;
  Option local_78;
  
  _w = this->output_w + this->pad_left + this->pad_right;
  iVar12 = this->output_h + this->pad_top + this->pad_bottom;
  local_b8 = bottom_blob->elemsize;
  uVar20 = (~((this->kernel_w + -1) * this->dilation_w) + _w) / this->stride_w;
  iVar14 = (~((this->kernel_h + -1) * this->dilation_h) + iVar12) / this->stride_h;
  iVar21 = this->kernel_h * this->kernel_w;
  uVar15 = (long)bottom_blob->h / (long)iVar21;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  lVar23 = 0x10;
  if (((this->pad_bottom < 1 && this->pad_top < 1) && (this->pad_right < 1 && this->pad_left < 1))
     && (lVar23 = 8, &local_118 != top_blob)) {
    piVar5 = top_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_118.data = top_blob->data;
    local_118.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_118.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_118.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_118.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_118.elempack = top_blob->elempack;
    local_118.allocator = top_blob->allocator;
    uVar6 = top_blob->dims;
    uVar7 = top_blob->w;
    uVar8 = top_blob->h;
    uVar9 = top_blob->d;
    local_118.c = top_blob->c;
    local_118.cstep = top_blob->cstep;
    local_118.dims = uVar6;
    local_118.w = uVar7;
    local_118.h = uVar8;
    local_118.d = uVar9;
  }
  iVar22 = (int)uVar15;
  local_d0 = top_blob;
  local_c8 = bottom_blob;
  local_b0 = opt;
  Mat::create(&local_118,_w,iVar12,iVar22,local_b8,*(Allocator **)(&opt->lightmode + lVar23));
  iVar12 = -100;
  local_80 = local_118.data;
  if ((local_118.data == (void *)0x0) ||
     (local_c0 = local_118.cstep, (long)local_118.c * local_118.cstep == 0)) goto LAB_0054f295;
  if (0 < iVar22) {
    iVar12 = this->stride_w;
    iVar22 = this->stride_h;
    piVar5 = &local_c8->w;
    psVar1 = &local_c8->elemsize;
    local_90 = local_c8->data;
    uVar16 = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
    local_c0 = local_118.cstep * uVar16;
    lVar23 = (long)local_118.h * (long)local_118.w;
    uVar19 = 0;
    iVar4 = (int)((uVar16 * lVar23 + 0xf & 0xfffffffffffffff0) / uVar16);
    if (local_118.dims == 4) {
      iVar4 = (int)lVar23;
    }
    local_c8 = (Mat *)(ulong)(uint)(iVar4 * local_118.d);
    local_88 = uVar15 & 0xffffffff;
    uVar2 = this->kernel_w;
    uVar3 = this->kernel_h;
    local_98 = uVar16 * (long)local_118.w;
    local_a0 = (long)local_c8 * 4;
    local_a8 = (long)iVar21 * (long)*piVar5 * *psVar1;
    do {
      __s = (void *)(local_c0 * uVar19 + (long)local_80);
      if (0 < (int)local_c8) {
        memset(__s,0,local_a0);
      }
      if (0 < (int)uVar3) {
        pfVar11 = (float *)(uVar19 * local_a8 + (long)local_90);
        local_b8 = this->dilation_h * local_98;
        iVar21 = this->dilation_w;
        uVar15 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar16 = 0;
            do {
              if (-1 < iVar14) {
                pfVar17 = (float *)((long)__s + uVar16 * (long)iVar21 * 4 + uVar15 * local_b8);
                iVar4 = this->stride_w;
                iVar18 = 0;
                do {
                  iVar13 = uVar20 + 1;
                  if (-1 < (int)uVar20) {
                    do {
                      *pfVar17 = *pfVar17 + *pfVar11;
                      pfVar11 = pfVar11 + 1;
                      pfVar17 = pfVar17 + iVar4;
                      iVar13 = iVar13 + -1;
                    } while (iVar13 != 0);
                  }
                  pfVar17 = pfVar17 + (int)(_w * iVar22 + ~uVar20 * iVar12);
                  bVar24 = iVar18 != iVar14;
                  iVar18 = iVar18 + 1;
                } while (bVar24);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar2);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar3);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != local_88);
  }
  pMVar10 = local_d0;
  if ((this->pad_bottom < 1 && this->pad_top < 1) && (this->pad_right < 1 && this->pad_left < 1)) {
    if (&local_118 != local_d0) {
      piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = local_d0->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_d0->allocator == (Allocator *)0x0) {
            if (local_d0->data != (void *)0x0) {
              free(local_d0->data);
            }
          }
          else {
            (*local_d0->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar10->data = local_118.data;
      pMVar10->refcount = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      pMVar10->elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
      pMVar10->elempack = local_118.elempack;
      pMVar10->allocator = local_118.allocator;
      pMVar10->dims = local_118.dims;
      pMVar10->w = local_118.w;
      pMVar10->h = local_118.h;
      pMVar10->d = local_118.d;
      pMVar10->c = local_118.c;
      pMVar10->cstep = local_118.cstep;
    }
  }
  else {
    local_78.lightmode = local_b0->lightmode;
    local_78._1_3_ = *(undefined3 *)&local_b0->field_0x1;
    local_78.num_threads = local_b0->num_threads;
    local_78.blob_allocator = local_b0->blob_allocator;
    local_78.workspace_allocator = local_b0->workspace_allocator;
    local_78.openmp_blocktime = local_b0->openmp_blocktime;
    local_78.use_winograd_convolution = local_b0->use_winograd_convolution;
    local_78.use_sgemm_convolution = local_b0->use_sgemm_convolution;
    local_78.use_int8_inference = local_b0->use_int8_inference;
    local_78.use_vulkan_compute = local_b0->use_vulkan_compute;
    uVar15._0_1_ = local_b0->use_bf16_storage;
    uVar15._1_1_ = local_b0->use_fp16_packed;
    uVar15._2_1_ = local_b0->use_fp16_storage;
    uVar15._3_1_ = local_b0->use_fp16_arithmetic;
    uVar15._4_1_ = local_b0->use_int8_packed;
    uVar15._5_1_ = local_b0->use_int8_storage;
    uVar15._6_1_ = local_b0->use_int8_arithmetic;
    uVar15._7_1_ = local_b0->use_packing_layout;
    local_78.use_shader_pack8 = local_b0->use_shader_pack8;
    local_78.use_subgroup_basic = local_b0->use_subgroup_basic;
    local_78.use_subgroup_vote = local_b0->use_subgroup_vote;
    local_78.use_subgroup_ballot = local_b0->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = local_b0->use_subgroup_shuffle;
    local_78.use_image_storage = local_b0->use_image_storage;
    local_78.use_tensor_storage = local_b0->use_tensor_storage;
    local_78.use_reserved_0 = local_b0->use_reserved_0;
    local_78.flush_denormals = local_b0->flush_denormals;
    local_78.use_local_pool_allocator = local_b0->use_local_pool_allocator;
    local_78.use_shader_local_memory = local_b0->use_shader_local_memory;
    local_78.use_cooperative_matrix = local_b0->use_cooperative_matrix;
    local_78.use_winograd23_convolution = local_b0->use_winograd23_convolution;
    local_78.use_winograd43_convolution = local_b0->use_winograd43_convolution;
    local_78.use_winograd63_convolution = local_b0->use_winograd63_convolution;
    local_78.use_a53_a55_optimized_kernel = local_b0->use_a53_a55_optimized_kernel;
    local_78.use_reserved_7 = local_b0->use_reserved_7;
    local_78.use_reserved_8 = local_b0->use_reserved_8;
    local_78.use_reserved_9 = local_b0->use_reserved_9;
    local_78.use_reserved_10 = local_b0->use_reserved_10;
    local_78.use_reserved_11 = local_b0->use_reserved_11;
    local_78._32_8_ = uVar15 & 0xffffffffffffff;
    copy_cut_border(&local_118,local_d0,this->pad_top,this->pad_bottom,this->pad_left,
                    this->pad_right,&local_78);
    if (pMVar10->data == (void *)0x0) {
      iVar12 = -100;
      goto LAB_0054f295;
    }
    iVar12 = -100;
    if ((long)pMVar10->c * pMVar10->cstep == 0) goto LAB_0054f295;
  }
  iVar12 = 0;
LAB_0054f295:
  piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int Fold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int size = bottom_blob.w;
    const int max_channels = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = output_w + pad_left + pad_right;
    const int outh = output_h + pad_top + pad_bottom;

    const int inw = (outw - kernel_extent_w) / stride_w + 1;
    const int inh = (outh - kernel_extent_h) / stride_h + 1;

    // assert inw * inh == size

    const int maxk = kernel_w * kernel_h;
    const int channels = max_channels / maxk;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    // col2im
    const int gap = outw * stride_h - inw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* sptr = bottom_blob.row(p * maxk);
        Mat outm = top_blob_bordered.channel(p);

        outm.fill(0.f);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < inh; i++)
                {
                    for (int j = 0; j < inw; j++)
                    {
                        ptr[0] += sptr[0];

                        ptr += stride_w;
                        sptr += 1;
                    }

                    ptr += gap;
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.use_packing_layout = false;
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt_b);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}